

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<absl::lts_20250127::btree_set<int,std::less<int>,std::allocator<int>>,void>
               (btree_set<int,_std::less<int>,_std::allocator<int>_> *container,ostream *os)

{
  bool bVar1;
  reference piVar2;
  long lVar3;
  const_iterator cVar4;
  const_iterator other;
  char local_41;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  local_40;
  
  local_40.node_ =
       (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
        *)CONCAT71(local_40.node_._1_7_,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_40,1);
  cVar4 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::begin((btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                   *)container);
  local_40.node_ = cVar4.node_;
  local_40.position_ = cVar4.position_;
  cVar4 = absl::lts_20250127::container_internal::
          btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::end((btree<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                 *)container);
  bVar1 = absl::lts_20250127::container_internal::
          btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
          ::Equals(&local_40,cVar4);
  if (!bVar1) {
    lVar3 = 0;
    do {
      piVar2 = absl::lts_20250127::container_internal::
               btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
               ::operator*(&local_40);
      if (lVar3 == 0) {
LAB_006fcc6d:
        local_41 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_41,1);
        std::ostream::operator<<(os,*piVar2);
        lVar3 = lVar3 + 1;
        bVar1 = true;
      }
      else {
        local_41 = ',';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_41,1);
        if (lVar3 != 0x20) goto LAB_006fcc6d;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar3 = 0x20;
        bVar1 = false;
      }
      if (!bVar1) break;
      absl::lts_20250127::container_internal::
      btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
      ::increment(&local_40);
      other._12_4_ = 0;
      other.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                     *)SUB128(cVar4._0_12_,0);
      other.position_ = SUB124(cVar4._0_12_,8);
      bVar1 = absl::lts_20250127::container_internal::
              btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
              ::Equals(&local_40,other);
    } while (!bVar1);
    if (lVar3 != 0) {
      local_40.node_ =
           (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            *)CONCAT71(local_40.node_._1_7_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_40,1);
    }
  }
  local_40.node_ =
       (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
        *)CONCAT71(local_40.node_._1_7_,0x7d);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_40,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }